

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  u8 *prcErr;
  uint uVar1;
  KeyInfo *pKVar2;
  uint uVar3;
  undefined1 *puVar4;
  u8 uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ushort uVar13;
  Mem *pMem2;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  u32 s1;
  uint local_7c;
  MemValue local_78;
  undefined1 *local_70;
  undefined8 uStack_68;
  sqlite3 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pMem2 = pPKey2->aMem;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  if (bSkip == 0) {
    local_3c = (uint)*pKey1;
    if ((char)*pKey1 < '\0') {
      bVar6 = sqlite3GetVarint32((uchar *)pKey1,&local_3c);
      uVar18 = (ulong)bVar6;
    }
    else {
      uVar18 = 1;
    }
    uVar14 = 0;
    uVar19 = local_3c;
    uVar16 = local_3c;
  }
  else {
    local_3c = (uint)*(byte *)((long)pKey1 + 1);
    uVar18 = 2;
    if ((char)*(byte *)((long)pKey1 + 1) < '\0') {
      uVar5 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),&local_3c);
      uVar18 = (ulong)(byte)(uVar5 + 1);
    }
    if (local_3c < 0x80) {
      uVar19 = (uint)""[local_3c];
    }
    else {
      uVar19 = local_3c - 0xc >> 1;
    }
    pMem2 = pMem2 + 1;
    uVar14 = 1;
    uVar19 = uVar19 + *pKey1;
    uVar16 = (uint)*pKey1;
  }
  prcErr = &pPKey2->errCode;
  if (uVar19 <= (uint)nKey1) {
    local_78.i = -1;
LAB_00151e8a:
    uVar13 = pMem2->flags;
    if ((uVar13 & 0x24) == 0) {
      if ((uVar13 & 8) != 0) {
        bVar6 = *(byte *)((long)pKey1 + uVar18);
        uVar17 = (uint)bVar6;
        if (9 < bVar6) goto LAB_0015235f;
        iVar9 = -1;
        if (bVar6 == 7) {
          iVar7 = serialGet7((uchar *)((ulong)uVar19 + (long)pKey1),(Mem *)&local_78);
          uVar17 = 1;
          if ((iVar7 == 0) && (iVar9 = -1, (pMem2->u).r <= local_78.r)) {
            uVar17 = 7;
            if ((pMem2->u).r < local_78.r) {
LAB_001523ac:
              uVar17 = 1;
              goto LAB_001523b2;
            }
            goto LAB_00152294;
          }
        }
        else if (bVar6 != 0) {
          sqlite3VdbeSerialGet((uchar *)((ulong)uVar19 + (long)pKey1),(uint)bVar6,(Mem *)&local_78);
          iVar7 = sqlite3IntFloatCompare(local_78.i,(pMem2->u).r);
          goto LAB_001521f8;
        }
        goto LAB_001523d8;
      }
      if ((uVar13 & 2) == 0) {
        bVar6 = *(byte *)((long)pKey1 + uVar18);
        uVar17 = (uint)bVar6;
        if ((uVar13 & 0x10) == 0) {
          if ((uVar17 != 0) && (bVar6 != 10)) {
            if (bVar6 == 7) {
              iVar9 = serialGet7((uchar *)((ulong)uVar19 + (long)pKey1),(Mem *)&local_78);
              uVar17 = 7;
              if (iVar9 == 0) goto LAB_001523ac;
              goto LAB_00152294;
            }
            goto LAB_001523b2;
          }
          goto LAB_00152294;
        }
        local_7c = uVar17;
        if ((char)bVar6 < '\0') {
          sqlite3GetVarint32((uchar *)(uVar18 + (long)pKey1),&local_7c);
        }
        uVar17 = local_7c;
        iVar9 = -1;
        if ((0xb < local_7c) && ((local_7c & 1) == 0)) {
          uVar8 = local_7c - 0xc >> 1;
          if (uVar8 + uVar19 <= (uint)nKey1) {
            if ((pMem2->flags & 0x400) == 0) {
LAB_001521b9:
              uVar17 = local_7c;
              uVar1 = pMem2->n;
              uVar3 = uVar1;
              if ((int)uVar8 < (int)uVar1) {
                uVar3 = uVar8;
              }
              iVar9 = memcmp((void *)((ulong)uVar19 + (long)pKey1),pMem2->z,(long)(int)uVar3);
              iVar7 = uVar8 - uVar1;
              if (iVar9 != 0) {
                uVar17 = 1;
                goto LAB_001523d8;
              }
            }
            else {
              if (local_7c - 0xc != 0) {
                uVar15 = 0;
                do {
                  if (*(char *)((long)pKey1 + uVar15 + uVar19) != '\0') {
                    iVar9 = 1;
                    goto LAB_00152375;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar8 != uVar15);
              }
              iVar7 = uVar8 - (pMem2->u).nZero;
            }
LAB_001521f8:
            iVar9 = iVar7;
            if (iVar9 == 0) goto LAB_00152294;
            goto LAB_001523d8;
          }
          uVar11 = 0x15f6d;
          goto LAB_00151e62;
        }
      }
      else {
        local_7c = (uint)*(byte *)((long)pKey1 + uVar18);
        if ((char)*(byte *)((long)pKey1 + uVar18) < '\0') {
          sqlite3GetVarint32((uchar *)(uVar18 + (long)pKey1),&local_7c);
        }
        puVar4 = uStack_68;
        uVar17 = local_7c;
        if (local_7c < 0xc) {
          iVar9 = -1;
          goto LAB_001523d8;
        }
        if ((local_7c & 1) != 0) {
          uVar8 = local_7c - 0xc >> 1;
          uStack_68 = (undefined1 *)CONCAT44(uStack_68._4_4_,uVar8);
          if ((uVar8 + uVar19 <= (uint)nKey1) &&
             (pKVar2 = pPKey2->pKeyInfo, uVar14 < pKVar2->nAllField)) {
            if (pKVar2->aColl[uVar14] == (CollSeq *)0x0) goto LAB_001521b9;
            uStack_68._7_1_ = SUB81(puVar4,7);
            local_60 = pKVar2->db;
            uStack_68 = (undefined1 *)
                        CONCAT26(CONCAT11(uStack_68._7_1_,pKVar2->enc),CONCAT24(2,uVar8));
            local_70 = (undefined1 *)((ulong)uVar19 + (long)pKey1);
            iVar7 = vdbeCompareMemString((Mem *)&local_78,pMem2,pKVar2->aColl[uVar14],prcErr);
            goto LAB_001521f8;
          }
          iVar9 = 0;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x15f4f,
                      "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
          *prcErr = '\v';
          goto LAB_0015240e;
        }
        uVar17 = 1;
        iVar9 = 1;
      }
    }
    else {
      bVar6 = *(byte *)((long)pKey1 + uVar18);
      uVar17 = (uint)bVar6;
      if (9 < bVar6) {
LAB_0015235f:
        iVar9 = (uint)(bVar6 != 10) * 2 + -1;
LAB_00152375:
        bVar20 = false;
        goto LAB_001523de;
      }
      if (bVar6 == 7) {
        serialGet7((uchar *)((ulong)uVar19 + (long)pKey1),(Mem *)&local_78);
        iVar9 = sqlite3IntFloatCompare((pMem2->u).i,local_78.r);
        uVar17 = 7;
        iVar7 = -iVar9;
        goto LAB_001521f8;
      }
      iVar9 = -1;
      if (bVar6 == 0) goto LAB_001523d8;
      if (5 < bVar6 - 1) {
        uVar15 = (ulong)(uVar17 - 8);
        goto LAB_00152285;
      }
      uVar10 = (ulong)uVar19;
      switch((uint)bVar6) {
      case 1:
        uVar15 = (ulong)*(char *)((long)pKey1 + uVar10);
        break;
      case 2:
        uVar12 = (long)*(char *)((long)pKey1 + uVar10) << 8;
        uVar15 = (ulong)*(byte *)((long)pKey1 + uVar10 + 1);
        goto LAB_00152273;
      case 3:
        uVar15 = (ulong)*(byte *)((long)pKey1 + uVar10 + 1) << 8 |
                 (long)*(char *)((long)pKey1 + uVar10) << 0x10;
        bVar6 = *(byte *)((long)pKey1 + uVar10 + 2);
        goto LAB_00152260;
      case 4:
        uVar15 = (ulong)*(byte *)((long)pKey1 + uVar10 + 2) << 8 |
                 (long)(int)((uint)*(byte *)((long)pKey1 + uVar10) << 0x18) |
                 (ulong)*(byte *)((long)pKey1 + uVar10 + 1) << 0x10;
        bVar6 = *(byte *)((long)pKey1 + uVar10 + 3);
LAB_00152260:
        uVar15 = bVar6 | uVar15;
        break;
      case 5:
        uVar8 = *(uint *)((long)pKey1 + uVar10 + 2);
        uVar12 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                        uVar8 << 0x18);
        uVar15 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar10),
                                            *(undefined1 *)((long)pKey1 + uVar10 + 1)) << 0x20;
LAB_00152273:
        uVar15 = uVar15 | uVar12;
        break;
      case 6:
        uVar15 = *(ulong *)((long)pKey1 + uVar10);
        uVar15 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                 (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                 (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                 (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38;
      }
LAB_00152285:
      if ((pMem2->u).i <= (long)uVar15) {
        if ((pMem2->u).i < (long)uVar15) {
LAB_001523b2:
          iVar9 = 1;
          goto LAB_001523d8;
        }
LAB_00152294:
        uVar14 = uVar14 + 1;
        if (uVar14 == pPKey2->nField) {
LAB_0015232a:
          pPKey2->eqSeen = '\x01';
          iVar9 = (int)pPKey2->default_rc;
          goto LAB_0015240e;
        }
        if (uVar17 < 0x80) {
          uVar8 = (uint)""[uVar17];
        }
        else {
          uVar8 = uVar17 - 0xc >> 1;
        }
        uVar19 = uVar19 + uVar8;
        if ((uint)nKey1 < uVar19) goto LAB_0015232a;
        iVar9 = 1;
        if (0x7f < uVar17) {
          uVar15 = (ulong)uVar17;
          do {
            iVar9 = iVar9 + 1;
            bVar20 = 0x3fff < uVar15;
            uVar15 = uVar15 >> 7;
          } while (bVar20);
        }
        uVar17 = (int)uVar18 + iVar9;
        uVar18 = (ulong)uVar17;
        if (uVar16 <= uVar17) goto LAB_00152338;
        pMem2 = pMem2 + 1;
        goto LAB_00151e8a;
      }
    }
LAB_001523d8:
    bVar20 = uVar17 == 0;
LAB_001523de:
    bVar6 = pPKey2->pKeyInfo->aSortFlags[uVar14 & 0xffffffff];
    if (bVar6 == 0) goto LAB_0015240e;
    if ((bVar6 & 2) != 0) {
      uVar13 = 1;
      if (!bVar20) {
        uVar13 = pMem2->flags & 1;
      }
      if ((bVar6 & 1) == uVar13) goto LAB_0015240e;
    }
    iVar9 = -iVar9;
    goto LAB_0015240e;
  }
  uVar11 = 0x15efe;
LAB_00151e62:
  iVar9 = 0;
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar11,
              "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  *prcErr = '\v';
LAB_0015240e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar9;
LAB_00152338:
  uVar11 = 0x15fa0;
  goto LAB_00151e62;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1 = aKey1[1];
    if( s1<0x80 ){
      idx1 = 2;
    }else{
      idx1 = 1 + sqlite3GetVarint32(&aKey1[1], &s1);
    }
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    if( (szHdr1 = aKey1[0])<0x80 ){
      idx1 = 1;
    }else{
      idx1 = sqlite3GetVarint32(aKey1, &szHdr1);
    }
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortFlags!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  while( 1 /*exit-by-break*/ ){
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        serialGet7(&aKey1[d1], &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future
        ** use", so it doesn't really matter what the results of comparing
        ** them to numeric values are.  */
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        if( serial_type==7 ){
          if( serialGet7(&aKey1[d1], &mem1) ){
            rc = -1;  /* mem1 is a NaN */
          }else if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }else{
            assert( rc==0 );
          }
        }else{
          sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n;
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      if( serial_type==0
       || serial_type==10
       || (serial_type==7 && serialGet7(&aKey1[d1], &mem1)!=0)
      ){
        assert( rc==0 );
      }else{
        rc = 1;
      }
    }

    if( rc!=0 ){
      int sortFlags = pPKey2->pKeyInfo->aSortFlags[i];
      if( sortFlags ){
        if( (sortFlags & KEYINFO_ORDER_BIGNULL)==0
         || ((sortFlags & KEYINFO_ORDER_DESC)
           !=(serial_type==0 || (pRhs->flags&MEM_Null)))
        ){
          rc = -rc;
        }
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    if( d1>(unsigned)nKey1 ) break;
    idx1 += sqlite3VarintLen(serial_type);
    if( idx1>=(unsigned)szHdr1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;  /* Corrupt index */
    }
  }

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc)
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}